

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraphFlattener::convertMultiLevelInstances
          (SceneGraphFlattener *this,Ref<embree::SceneGraph::Node> *node)

{
  Node *pNVar1;
  mapped_type *pmVar2;
  GroupNode *this_00;
  Node *pNVar3;
  key_type *in_RDX;
  Node *pNVar4;
  bool bVar5;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  group;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  local_38;
  
  pNVar4 = node[3].ptr;
  pNVar1 = (Node *)(node + 2);
  pNVar3 = pNVar1;
  if (pNVar4 != (Node *)0x0) {
    do {
      bVar5 = (Node *)(pNVar4->fileName).field_2._M_allocated_capacity < in_RDX->ptr;
      if (!bVar5) {
        pNVar3 = pNVar4;
      }
      pNVar4 = (Node *)(&(pNVar4->fileName)._M_dataplus)[bVar5]._M_p;
    } while (pNVar4 != (Node *)0x0);
  }
  pNVar4 = pNVar1;
  if ((pNVar3 != pNVar1) &&
     (pNVar4 = pNVar3, in_RDX->ptr < (Node *)(pNVar3->fileName).field_2._M_allocated_capacity)) {
    pNVar4 = pNVar1;
  }
  if (pNVar4 == pNVar1) {
    local_38.
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    convertMultiLevelInstances((SceneGraphFlattener *)node,&local_38,in_RDX);
    this_00 = (GroupNode *)operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_00,&local_38);
    pmVar2 = std::
             map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)(node + 1),in_RDX);
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
    if (pmVar2->ptr != (Node *)0x0) {
      (*(pmVar2->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar2->ptr = (Node *)this_00;
    (this->node).ptr = (Node *)this_00;
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::~vector(&local_38);
  }
  else {
    pmVar2 = std::
             map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)(node + 1),in_RDX);
    pNVar1 = pmVar2->ptr;
    (this->node).ptr = pNVar1;
    if (pNVar1 != (Node *)0x0) {
      (*(pNVar1->super_RefCount)._vptr_RefCount[2])();
    }
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> convertMultiLevelInstances(const Ref<SceneGraph::Node>& node)
    {
      if (object_mapping.find(node) != object_mapping.end()) {
        return object_mapping[node];
      }
      
      std::vector<Ref<SceneGraph::Node>> group;
      convertMultiLevelInstances(group,node);
      auto new_node = new SceneGraph::GroupNode(group);
      object_mapping[node] = new_node;
      return new_node;
    }